

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath_test.cpp
# Opt level: O1

void __thiscall DirectionCone_BoundBounds_Test::TestBody(DirectionCone_BoundBounds_Test *this)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  bool bVar5;
  uint uVar6;
  byte bVar7;
  ulong uVar8;
  Bounds3<float> *pBVar9;
  float *pfVar10;
  undefined8 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  undefined8 *extraout_RDX_01;
  undefined8 *extraout_RDX_02;
  undefined8 *puVar11;
  char *pcVar12;
  char *in_R9;
  uint64_t oldstate;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  undefined8 uVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar23 [32];
  Float t0;
  float fVar24;
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 extraout_var [60];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  Float t1;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar56 [16];
  undefined1 auVar59 [64];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined4 uVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 in_XMM11 [16];
  Float radius_2;
  Float radius;
  AssertionResult gtest_ar;
  Float theta;
  Bounds3f b;
  AssertHelper local_168;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_160;
  AssertHelper local_158;
  undefined1 local_150 [8];
  undefined1 local_148 [16];
  undefined1 local_138 [8];
  float local_130;
  undefined4 uStack_12c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined8 local_e0;
  float local_d8;
  float local_d4;
  char local_d0;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  AssertHelper local_a8;
  float local_9c;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  ulong local_78;
  Bounds3<float> local_70;
  undefined1 local_58 [32];
  undefined1 auVar22 [32];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  
  local_70.pMin.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  local_70.pMin.super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  auVar19._8_4_ = 0x3f800000;
  auVar19._0_8_ = 0x3f8000003f800000;
  auVar19._12_4_ = 0x3f800000;
  local_70.pMin.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  local_70.pMax.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar19);
  local_70.pMax.super_Tuple3<pbrt::Point3,_float>.z = 1.0;
  local_138 = (undefined1  [8])0x0;
  local_130 = 0.0;
  pbrt::Bounds3<float>::BoundingSphere(&local_70,(Point3<float> *)local_138,(Float *)local_150);
  auVar65._8_8_ = 0;
  auVar65._0_8_ = local_138;
  auVar19 = vmovshdup_avx(auVar65);
  fVar25 = 0.2 - auVar19._0_4_;
  auVar19 = ZEXT416((uint)(0.1 - local_138._0_4_));
  auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar25 * fVar25)),auVar19,auVar19);
  auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)(0.3 - local_130)),
                            ZEXT416((uint)(0.3 - local_130)));
  if ((float)local_150._0_4_ * (float)local_150._0_4_ <= auVar19._0_4_) {
    local_f8._0_4_ = local_138._0_4_ + -0.1;
    local_f8._4_4_ = local_138._4_4_ + -0.2;
    local_f8._8_8_ = 0;
    local_d8 = local_130 + -0.3;
    auVar26._0_4_ = (float)local_f8._0_4_ * (float)local_f8._0_4_;
    auVar26._4_4_ = local_f8._4_4_ * local_f8._4_4_;
    auVar26._8_8_ = 0;
    auVar19 = vmovshdup_avx(auVar26);
    auVar19 = vfmadd231ss_fma(auVar19,local_f8,local_f8);
    auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)local_d8),ZEXT416((uint)local_d8));
    if (auVar19._0_4_ < 0.0) {
      local_108._0_4_ = local_d8;
      auVar59._0_4_ = sqrtf(auVar19._0_4_);
      auVar59._4_60_ = extraout_var;
      auVar19 = auVar59._0_16_;
      local_d8 = (float)local_108._0_4_;
    }
    else {
      auVar19 = vsqrtss_avx(auVar19,auVar19);
    }
    local_d8 = local_d8 / auVar19._0_4_;
    auVar65 = vfmadd231ss_fma(ZEXT416((uint)(((float)local_138._4_4_ + -0.2) *
                                            ((float)local_138._4_4_ + -0.2))),
                              ZEXT416((uint)((float)local_138._0_4_ + -0.1)),
                              ZEXT416((uint)((float)local_138._0_4_ + -0.1)));
    auVar65 = vfmadd231ss_fma(auVar65,ZEXT416((uint)(local_130 + -0.3)),
                              ZEXT416((uint)(local_130 + -0.3)));
    auVar65 = vmaxss_avx(ZEXT416((uint)(1.0 - ((float)local_150._0_4_ * (float)local_150._0_4_) /
                                              auVar65._0_4_)),ZEXT816(0) << 0x40);
    local_108._0_4_ = local_d8;
    if (auVar65._0_4_ < 0.0) {
      local_118 = auVar19;
      local_d4 = sqrtf(auVar65._0_4_);
      auVar19 = local_118;
      local_d8 = (float)local_108._0_4_;
    }
    else {
      auVar65 = vsqrtss_avx(auVar65,auVar65);
      local_d4 = auVar65._0_4_;
    }
    uVar67 = auVar19._0_4_;
    auVar27._4_4_ = uVar67;
    auVar27._0_4_ = uVar67;
    auVar27._8_4_ = uVar67;
    auVar27._12_4_ = uVar67;
    auVar19 = vdivps_avx(local_f8,auVar27);
    auVar28._0_4_ = auVar19._0_4_ * auVar19._0_4_;
    auVar28._4_4_ = auVar19._4_4_ * auVar19._4_4_;
    auVar28._8_4_ = auVar19._8_4_ * auVar19._8_4_;
    auVar28._12_4_ = auVar19._12_4_ * auVar19._12_4_;
    auVar65 = vmovshdup_avx(auVar28);
    auVar65 = vfmadd231ss_fma(auVar65,auVar19,auVar19);
    auVar65 = vfmadd231ss_fma(auVar65,ZEXT416((uint)local_d8),ZEXT416((uint)local_d8));
    if (auVar65._0_4_ < 0.0) {
      local_f8._0_4_ = local_d4;
      local_118 = auVar19;
      fVar25 = sqrtf(auVar65._0_4_);
      auVar19 = local_118;
      local_d4 = (float)local_f8._0_4_;
      local_d8 = (float)local_108._0_4_;
    }
    else {
      auVar65 = vsqrtss_avx(auVar65,auVar65);
      fVar25 = auVar65._0_4_;
    }
    auVar50._4_4_ = fVar25;
    auVar50._0_4_ = fVar25;
    auVar50._8_4_ = fVar25;
    auVar50._12_4_ = fVar25;
    auVar19 = vdivps_avx(auVar19,auVar50);
    local_d8 = local_d8 / fVar25;
  }
  else {
    local_d4 = -1.0;
    local_d8 = 1.0;
    auVar19 = ZEXT816(0);
  }
  local_e0 = vmovlps_avx(auVar19);
  local_d0 = 0;
  local_150._0_4_ = 0xbf800000;
  testing::internal::CmpHelperEQ<float,float>
            ((internal *)local_138,"std::cos(Pi)","c.cosTheta",(float *)local_150,&local_d4);
  if (local_138[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_150);
    if ((undefined8 *)CONCAT44(uStack_12c,local_130) == (undefined8 *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = *(char **)CONCAT44(uStack_12c,local_130);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/vecmath_test.cpp"
               ,0x18d,pcVar12);
    testing::internal::AssertHelper::operator=(&local_168,(Message *)local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    if (local_150 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_150 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_150 + 8))();
      }
      local_150 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_130,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_138 = (undefined1  [8])0x0;
  local_130 = 0.0;
  pbrt::Bounds3<float>::BoundingSphere(&local_70,(Point3<float> *)local_138,(Float *)local_150);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = local_138;
  auVar19 = vmovshdup_avx(auVar29);
  fVar25 = 0.5 - auVar19._0_4_;
  auVar19 = ZEXT416((uint)(-0.5 - local_138._0_4_));
  auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar25 * fVar25)),auVar19,auVar19);
  auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)(0.5 - local_130)),
                            ZEXT416((uint)(0.5 - local_130)));
  if ((float)local_150._0_4_ * (float)local_150._0_4_ <= auVar19._0_4_) {
    local_f8._0_4_ = local_138._0_4_ + 0.5;
    local_f8._4_4_ = local_138._4_4_ + -0.5;
    local_f8._8_8_ = 0;
    fVar25 = local_130 + -0.5;
    auVar30._0_4_ = (float)local_f8._0_4_ * (float)local_f8._0_4_;
    auVar30._4_4_ = local_f8._4_4_ * local_f8._4_4_;
    auVar30._8_8_ = 0;
    auVar19 = vmovshdup_avx(auVar30);
    auVar19 = vfmadd231ss_fma(auVar19,local_f8,local_f8);
    auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)fVar25),ZEXT416((uint)fVar25));
    if (auVar19._0_4_ < 0.0) {
      local_108._0_4_ = fVar25;
      auVar48._0_4_ = sqrtf(auVar19._0_4_);
      auVar48._4_60_ = extraout_var_00;
      auVar19 = auVar48._0_16_;
      fVar25 = (float)local_108._0_4_;
    }
    else {
      auVar19 = vsqrtss_avx(auVar19,auVar19);
    }
    fVar25 = fVar25 / auVar19._0_4_;
    auVar65 = vfmadd231ss_fma(ZEXT416((uint)(((float)local_138._4_4_ + -0.5) *
                                            ((float)local_138._4_4_ + -0.5))),
                              ZEXT416((uint)((float)local_138._0_4_ + 0.5)),
                              ZEXT416((uint)((float)local_138._0_4_ + 0.5)));
    auVar65 = vfmadd231ss_fma(auVar65,ZEXT416((uint)(local_130 + -0.5)),
                              ZEXT416((uint)(local_130 + -0.5)));
    auVar65 = vmaxss_avx(ZEXT416((uint)(1.0 - ((float)local_150._0_4_ * (float)local_150._0_4_) /
                                              auVar65._0_4_)),ZEXT816(0) << 0x40);
    local_108._0_4_ = fVar25;
    if (auVar65._0_4_ < 0.0) {
      local_118 = auVar19;
      fVar62 = sqrtf(auVar65._0_4_);
      auVar19 = local_118;
      fVar25 = (float)local_108._0_4_;
    }
    else {
      auVar65 = vsqrtss_avx(auVar65,auVar65);
      fVar62 = auVar65._0_4_;
    }
    uVar67 = auVar19._0_4_;
    auVar31._4_4_ = uVar67;
    auVar31._0_4_ = uVar67;
    auVar31._8_4_ = uVar67;
    auVar31._12_4_ = uVar67;
    auVar19 = vdivps_avx(local_f8,auVar31);
    auVar32._0_4_ = auVar19._0_4_ * auVar19._0_4_;
    auVar32._4_4_ = auVar19._4_4_ * auVar19._4_4_;
    auVar32._8_4_ = auVar19._8_4_ * auVar19._8_4_;
    auVar32._12_4_ = auVar19._12_4_ * auVar19._12_4_;
    auVar65 = vmovshdup_avx(auVar32);
    auVar65 = vfmadd231ss_fma(auVar65,auVar19,auVar19);
    auVar65 = vfmadd231ss_fma(auVar65,ZEXT416((uint)fVar25),ZEXT416((uint)fVar25));
    if (auVar65._0_4_ < 0.0) {
      local_f8._0_4_ = fVar62;
      local_118 = auVar19;
      local_d8 = sqrtf(auVar65._0_4_);
      auVar19 = local_118;
      local_d4 = (float)local_f8._0_4_;
      fVar25 = (float)local_108._0_4_;
    }
    else {
      auVar65 = vsqrtss_avx(auVar65,auVar65);
      local_d8 = auVar65._0_4_;
      local_d4 = fVar62;
    }
    auVar51._4_4_ = local_d8;
    auVar51._0_4_ = local_d8;
    auVar51._8_4_ = local_d8;
    auVar51._12_4_ = local_d8;
    auVar19 = vdivps_avx(auVar19,auVar51);
    local_d8 = fVar25 / local_d8;
  }
  else {
    local_d4 = -1.0;
    local_d8 = 1.0;
    auVar19 = ZEXT816(0);
  }
  local_e0 = vmovlps_avx(auVar19);
  local_d0 = '\0';
  local_9c = acosf(local_d4);
  local_150 = (undefined1  [8])&DAT_3fee92bc782b6ae8;
  testing::internal::CmpHelperGE<float,double>
            ((internal *)local_138,"theta","1.0001 * precise",&local_9c,(double *)local_150);
  if (local_138[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_150);
    if ((undefined8 *)CONCAT44(uStack_12c,local_130) == (undefined8 *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = *(char **)CONCAT44(uStack_12c,local_130);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/vecmath_test.cpp"
               ,0x197,pcVar12);
    testing::internal::AssertHelper::operator=(&local_168,(Message *)local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    if (local_150 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_150 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_150 + 8))();
      }
      local_150 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_130,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_150 = (undefined1  [8])&DAT_3ff0d04644cccccd;
  testing::internal::CmpHelperLT<float,double>
            ((internal *)local_138,"theta","1.1 * precise",&local_9c,(double *)local_150);
  if (local_138[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_150);
    if ((undefined8 *)CONCAT44(uStack_12c,local_130) == (undefined8 *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = *(char **)CONCAT44(uStack_12c,local_130);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/vecmath_test.cpp"
               ,0x19a,pcVar12);
    testing::internal::AssertHelper::operator=(&local_168,(Message *)local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    if (local_150 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_150 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_150 + 8))();
      }
      local_150 = (undefined1  [8])0x0;
    }
  }
  uVar18 = 0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_130,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  auVar20 = vpbroadcastq_avx512vl();
  local_58 = vpaddq_avx2(auVar20,_DAT_005da740);
  uVar13 = 0xc0afa303d74a164b;
  do {
    uVar14 = uVar13 * 0x5851f42d4c957f2d + 0x401;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uVar13;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = uVar14;
    auVar26 = vpunpcklqdq_avx(auVar33,auVar52);
    auVar27 = vpmovsxbq_avx(ZEXT216(0x2d1b));
    auVar29 = vpsrlvq_avx2(auVar26,auVar27);
    auVar28 = vpmovsxbq_avx(ZEXT216(0x1b2d));
    auVar30 = vpsrlvq_avx2(auVar26,auVar28);
    uVar15 = uVar14 * 0x5851f42d4c957f2d + 0x401;
    uVar13 = uVar15 * 0x5851f42d4c957f2d + 0x401;
    uVar14 = uVar13 * 0x5851f42d4c957f2d + 0x401;
    uVar8 = uVar14 * 0x5851f42d4c957f2d + 0x401;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = uVar13;
    auVar63._8_8_ = 0;
    auVar63._0_8_ = uVar14;
    auVar50 = vpunpcklqdq_avx(auVar60,auVar63);
    auVar31 = vpsrlvq_avx2(auVar50,auVar27);
    auVar32 = vpsrlvq_avx2(auVar50,auVar28);
    uVar13 = uVar8 * 0x5851f42d4c957f2d + 0x401;
    auVar64._8_8_ = 0;
    auVar64._0_8_ = uVar8;
    auVar68._8_8_ = 0;
    auVar68._0_8_ = uVar15;
    auVar65 = vpunpcklqdq_avx(auVar68,auVar64);
    auVar19 = vpsrlvq_avx2(auVar65,auVar27);
    auVar51 = vpsrlvq_avx2(auVar65,auVar28);
    auVar19 = vpshufd_avx(auVar19 ^ auVar51,0xe8);
    auVar65 = vpsrlq_avx(auVar65,0x3b);
    auVar65 = vpshufd_avx(auVar65,0xe8);
    auVar19 = vprorvd_avx512vl(auVar19,auVar65);
    auVar19 = vcvtudq2ps_avx512vl(auVar19);
    auVar66._0_4_ = auVar19._0_4_ * 2.3283064e-10;
    auVar66._4_4_ = auVar19._4_4_ * 2.3283064e-10;
    auVar66._8_4_ = auVar19._8_4_ * 2.3283064e-10;
    auVar66._12_4_ = auVar19._12_4_ * 2.3283064e-10;
    auVar70._8_4_ = 0x3f7fffff;
    auVar70._0_8_ = 0x3f7fffff3f7fffff;
    auVar70._12_4_ = 0x3f7fffff;
    auVar19 = vminps_avx(auVar66,auVar70);
    auVar69._8_4_ = 0x3f800000;
    auVar69._0_8_ = 0x3f8000003f800000;
    auVar69._12_4_ = 0x3f800000;
    auVar65 = vsubps_avx(auVar69,auVar19);
    auVar51 = vfnmadd213ps_fma(auVar65,auVar69,auVar19);
    auVar19 = vpshufd_avx(auVar29 ^ auVar30,0xe8);
    auVar65 = vpsrlq_avx(auVar26,0x3b);
    auVar65 = vpshufd_avx(auVar65,0xe8);
    auVar19 = vprorvd_avx512vl(auVar19,auVar65);
    auVar19 = vcvtudq2ps_avx512vl(auVar19);
    auVar34._0_4_ = auVar19._0_4_ * 2.3283064e-10;
    auVar34._4_4_ = auVar19._4_4_ * 2.3283064e-10;
    auVar34._8_4_ = auVar19._8_4_ * 2.3283064e-10;
    auVar34._12_4_ = auVar19._12_4_ * 2.3283064e-10;
    auVar19 = vminps_avx(auVar34,auVar70);
    auVar65 = vsubps_avx(auVar69,auVar19);
    auVar29 = vfnmadd213ps_fma(auVar65,auVar69,auVar19);
    auVar19 = vpshufd_avx(auVar31 ^ auVar32,0xe8);
    auVar65 = vpsrlq_avx(auVar50,0x3b);
    auVar65 = vpshufd_avx(auVar65,0xe8);
    auVar19 = vprorvd_avx512vl(auVar19,auVar65);
    auVar19 = vcvtudq2ps_avx512vl(auVar19);
    auVar35._0_4_ = auVar19._0_4_ * 2.3283064e-10;
    auVar35._4_4_ = auVar19._4_4_ * 2.3283064e-10;
    auVar35._8_4_ = auVar19._8_4_ * 2.3283064e-10;
    auVar35._12_4_ = auVar19._12_4_ * 2.3283064e-10;
    auVar19 = vminps_avx(auVar35,auVar70);
    auVar65 = vsubps_avx(auVar69,auVar19);
    auVar50 = vfnmadd213ps_fma(auVar65,auVar69,auVar19);
    auVar19 = vminps_avx(auVar50,auVar29);
    auVar26 = vmovshdup_avx(auVar51);
    auVar65 = vminss_avx(auVar26,auVar51);
    local_150 = (undefined1  [8])vmovlps_avx(auVar19);
    local_148._0_4_ = auVar65._0_4_;
    auVar19 = vmaxps_avx(auVar50,auVar29);
    auVar65 = vmaxss_avx(auVar26,auVar51);
    local_148._4_8_ = vmovlps_avx(auVar19);
    local_148._12_4_ = auVar65._0_4_;
    uVar6 = (uint)(uVar13 >> 0x2d) ^ (uint)(uVar13 >> 0x1b);
    bVar7 = (byte)(uVar13 >> 0x3b);
    auVar19 = vcvtusi2ss_avx512f(in_XMM11,uVar6 >> bVar7 | uVar6 << 0x20 - bVar7);
    auVar19 = vminss_avx(ZEXT416((uint)(auVar19._0_4_ * 2.3283064e-10)),
                         SUB6416(ZEXT464(0x3f7fffff),0));
    local_108 = vfmadd231ss_fma(ZEXT416((uint)(auVar19._0_4_ * 4.0)),
                                ZEXT416((uint)(1.0 - auVar19._0_4_)),ZEXT416(0xc0800000));
    uVar13 = uVar13 * 0x5851f42d4c957f2d + 0x401;
    uVar14 = uVar13 * 0x5851f42d4c957f2d + 0x401;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar13;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = uVar14;
    auVar65 = vpunpcklqdq_avx(auVar36,auVar53);
    auVar19 = vpsrlvq_avx2(auVar65,auVar27);
    auVar26 = vpsrlvq_avx2(auVar65,auVar28);
    auVar19 = vpshufd_avx(auVar19 ^ auVar26,0xe8);
    auVar65 = vpsrlq_avx(auVar65,0x3b);
    auVar65 = vpshufd_avx(auVar65,0xe8);
    auVar19 = vprorvd_avx512vl(auVar19,auVar65);
    auVar20._0_16_ = vcvtudq2ps_avx512vl(auVar19);
    auVar37._0_4_ = auVar20._0_4_ * 2.3283064e-10;
    auVar37._4_4_ = auVar20._4_4_ * 2.3283064e-10;
    auVar37._8_4_ = auVar20._8_4_ * 2.3283064e-10;
    auVar37._12_4_ = auVar20._12_4_ * 2.3283064e-10;
    auVar19 = vminps_avx(auVar37,auVar70);
    auVar65 = vsubps_avx(auVar69,auVar19);
    auVar61._8_4_ = 0x40800000;
    auVar61._0_8_ = 0x4080000040800000;
    auVar61._12_4_ = 0x40800000;
    auVar38._0_4_ = auVar19._0_4_ * 4.0;
    auVar38._4_4_ = auVar19._4_4_ * 4.0;
    auVar38._8_4_ = auVar19._8_4_ * 4.0;
    auVar38._12_4_ = auVar19._12_4_ * 4.0;
    local_f8 = vfnmadd231ps_fma(auVar38,auVar61,auVar65);
    local_98 = vmovshdup_avx(local_f8);
    local_138 = (undefined1  [8])0x0;
    local_130 = 0.0;
    pbrt::Bounds3<float>::BoundingSphere
              ((Bounds3<float> *)local_150,(Point3<float> *)local_138,(Float *)&local_168);
    auVar39._8_8_ = 0;
    auVar39._0_8_ = local_138;
    auVar19 = vmovshdup_avx(auVar39);
    fVar25 = (float)local_f8._0_4_ - auVar19._0_4_;
    auVar19 = ZEXT416((uint)(local_108._0_4_ - local_138._0_4_));
    auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar25 * fVar25)),auVar19,auVar19);
    auVar65 = vfmadd231ss_fma(auVar19,ZEXT416((uint)((float)local_98._0_4_ - local_130)),
                              ZEXT416((uint)((float)local_98._0_4_ - local_130)));
    auVar19 = ZEXT816(0) << 0x20;
    fVar62 = 1.0;
    fVar25 = -1.0;
    puVar11 = extraout_RDX;
    if (local_168.data_._0_4_ * local_168.data_._0_4_ <= auVar65._0_4_) {
      fVar25 = local_130 - (float)local_98._0_4_;
      auVar20._0_16_ = vpermt2ps_avx512vl(local_f8,SUB6416(ZEXT464(4),0),local_108);
      local_c8 = vsubps_avx(auVar39,auVar20._0_16_);
      auVar40._0_4_ = local_c8._0_4_ * local_c8._0_4_;
      auVar40._4_4_ = local_c8._4_4_ * local_c8._4_4_;
      auVar40._8_4_ = local_c8._8_4_ * local_c8._8_4_;
      auVar40._12_4_ = local_c8._12_4_ * local_c8._12_4_;
      auVar19 = vmovshdup_avx(auVar40);
      auVar19 = vfmadd231ss_fma(auVar19,local_c8,local_c8);
      local_118._0_4_ = fVar25;
      auVar19 = vfmadd231ss_fma(auVar19,ZEXT416((uint)fVar25),ZEXT416((uint)fVar25));
      if (auVar19._0_4_ < 0.0) {
        auVar49._0_4_ = sqrtf(auVar19._0_4_);
        auVar49._4_60_ = extraout_var_01;
        auVar19 = auVar49._0_16_;
        puVar11 = extraout_RDX_00;
      }
      else {
        auVar19 = vsqrtss_avx(auVar19,auVar19);
      }
      auVar65 = vfmadd231ss_fma(ZEXT416((uint)(((float)local_138._4_4_ - (float)local_f8._0_4_) *
                                              ((float)local_138._4_4_ - (float)local_f8._0_4_))),
                                ZEXT416((uint)((float)local_138._0_4_ - (float)local_108._0_4_)),
                                ZEXT416((uint)((float)local_138._0_4_ - (float)local_108._0_4_)));
      auVar65 = vfmadd231ss_fma(auVar65,ZEXT416((uint)(local_130 - (float)local_98._0_4_)),
                                ZEXT416((uint)(local_130 - (float)local_98._0_4_)));
      auVar54._0_12_ = ZEXT812(0);
      auVar54._12_4_ = 0;
      auVar65 = vmaxss_avx(ZEXT416((uint)(1.0 - (local_168.data_._0_4_ * local_168.data_._0_4_) /
                                                auVar65._0_4_)),auVar54);
      if (auVar65._0_4_ < 0.0) {
        local_b8 = auVar19;
        fVar25 = sqrtf(auVar65._0_4_);
        puVar11 = extraout_RDX_01;
        auVar19 = local_b8;
      }
      else {
        auVar65 = vsqrtss_avx(auVar65,auVar65);
        fVar25 = auVar65._0_4_;
      }
      fVar62 = auVar19._0_4_;
      auVar41._4_4_ = fVar62;
      auVar41._0_4_ = fVar62;
      auVar41._8_4_ = fVar62;
      auVar41._12_4_ = fVar62;
      auVar19 = vdivps_avx(local_c8,auVar41);
      fVar62 = (float)local_118._0_4_ / fVar62;
      auVar42._0_4_ = auVar19._0_4_ * auVar19._0_4_;
      auVar42._4_4_ = auVar19._4_4_ * auVar19._4_4_;
      auVar42._8_4_ = auVar19._8_4_ * auVar19._8_4_;
      auVar42._12_4_ = auVar19._12_4_ * auVar19._12_4_;
      auVar65 = vmovshdup_avx(auVar42);
      auVar65 = vfmadd231ss_fma(auVar65,auVar19,auVar19);
      auVar65 = vfmadd231ss_fma(auVar65,ZEXT416((uint)fVar62),ZEXT416((uint)fVar62));
      if (auVar65._0_4_ < 0.0) {
        local_118._0_4_ = fVar25;
        local_b8._0_4_ = fVar62;
        local_c8 = auVar19;
        fVar24 = sqrtf(auVar65._0_4_);
        puVar11 = extraout_RDX_02;
        auVar19 = local_c8;
        fVar25 = (float)local_118._0_4_;
        fVar62 = (float)local_b8._0_4_;
      }
      else {
        auVar65 = vsqrtss_avx(auVar65,auVar65);
        fVar24 = auVar65._0_4_;
      }
      auVar55._4_4_ = fVar24;
      auVar55._0_4_ = fVar24;
      auVar55._8_4_ = fVar24;
      auVar55._12_4_ = fVar24;
      auVar19 = vdivps_avx(auVar19,auVar55);
      fVar62 = fVar62 / fVar24;
    }
    uVar13 = uVar14 * 0x5851f42d4c957f2d + 0x401;
    local_e0 = vmovlps_avx(auVar19);
    local_d0 = '\0';
    local_d4 = fVar25;
    local_d8 = fVar62;
    local_78 = uVar18;
    if ((local_108._0_4_ < (float)local_150._0_4_) || ((float)local_148._4_4_ < local_108._0_4_)) {
LAB_00337c07:
      iVar16 = 0;
      do {
        uVar14 = uVar13 * 0x5851f42d4c957f2d + 0x401;
        auVar44._8_8_ = 0;
        auVar44._0_8_ = uVar13;
        auVar56._8_8_ = 0;
        auVar56._0_8_ = uVar14;
        auVar65 = vpunpcklqdq_avx(auVar56,auVar44);
        auVar19 = vpsrlvq_avx2(auVar65,_DAT_005c85c0);
        auVar26 = vpsrlvq_avx2(auVar65,_DAT_005c85b0);
        auVar19 = vpshufd_avx(auVar26 ^ auVar19,0xe8);
        auVar65 = vpsrlq_avx(auVar65,0x3b);
        auVar65 = vpshufd_avx(auVar65,0xe8);
        auVar22._16_16_ = auVar20._16_16_;
        auVar19 = vprorvd_avx512vl(auVar19,auVar65);
        auVar19 = vcvtudq2ps_avx512vl(auVar19);
        auVar2._8_4_ = 0x2f800000;
        auVar2._0_8_ = 0x2f8000002f800000;
        auVar2._12_4_ = 0x2f800000;
        auVar65 = vmulps_avx512vl(auVar19,auVar2);
        auVar3._8_4_ = 0x3f7fffff;
        auVar3._0_8_ = 0x3f7fffff3f7fffff;
        auVar3._12_4_ = 0x3f7fffff;
        uVar18 = vcmpps_avx512vl(auVar65,auVar3,1);
        bVar7 = (byte)(uVar18 >> 1);
        auVar19 = vmovshdup_avx(auVar65);
        auVar22._0_16_ = SUB6416(ZEXT464(0x3f7fffff),0);
        auVar21._4_28_ = auVar22._4_28_;
        auVar21._0_4_ = (uint)(bVar7 & 1) * auVar19._0_4_ + (uint)!(bool)(bVar7 & 1) * 0x3f7fffff;
        local_88._0_4_ = auVar65._0_4_ * 6.2831855;
        local_b8 = vfmadd132ss_fma(auVar21._0_16_,SUB6416(ZEXT464(0x3f800000),0),ZEXT416(0xc0000000)
                                  );
        auVar19 = vfnmadd213ss_fma(local_b8,local_b8,SUB6416(ZEXT464(0x3f800000),0));
        auVar19 = vmaxss_avx(auVar19,ZEXT816(0));
        if (auVar19._0_4_ < 0.0) {
          local_118._0_4_ = (int)uVar18;
          local_88 = ZEXT416((uint)local_88._0_4_);
          fVar25 = sqrtf(auVar19._0_4_);
          uVar18 = (ulong)(uint)local_118._0_4_;
        }
        else {
          auVar19 = vsqrtss_avx(auVar19,auVar19);
          fVar25 = auVar19._0_4_;
        }
        uVar13 = uVar14 * 0x5851f42d4c957f2d + 0x401;
        auVar23._16_16_ = auVar22._16_16_;
        auVar23._0_16_ = SUB6416(ZEXT464(0x40c90fda),0);
        auVar20._4_28_ = auVar23._4_28_;
        auVar20._0_4_ =
             (float)((uint)((byte)uVar18 & 1) * local_88._0_4_ +
                    (uint)!(bool)((byte)uVar18 & 1) * 0x40c90fda);
        local_88 = auVar20._0_16_;
        local_c8._0_4_ = fVar25;
        fVar25 = cosf(auVar20._0_4_);
        local_118._0_4_ = fVar25 * (float)local_c8._0_4_;
        fVar25 = sinf((float)local_88._0_4_);
        local_c8._0_4_ = fVar25 * (float)local_c8._0_4_;
        auVar45._0_12_ = ZEXT812(0);
        auVar45._12_4_ = 0;
        bVar4 = false;
        uVar6 = 0;
        auVar59 = ZEXT464(0x7f800000);
        do {
          fVar25 = (float)local_118._0_4_;
          if ((uVar6 != 0) && (fVar25 = (float)local_c8._0_4_, uVar6 != 1)) {
            fVar25 = (float)local_b8._0_4_;
          }
          pBVar9 = (Bounds3<float> *)local_150;
          if ((uVar6 != 0) && (pBVar9 = (Bounds3<float> *)(local_150 + 4), uVar6 != 1)) {
            pBVar9 = (Bounds3<float> *)local_148;
          }
          fVar62 = (float)local_108._0_4_;
          if ((uVar6 != 0) && (fVar62 = (float)local_f8._0_4_, uVar6 != 1)) {
            fVar62 = (float)local_98._0_4_;
          }
          pfVar10 = (float *)(local_148 + 4);
          if ((uVar6 != 0) && (pfVar10 = (float *)(local_148 + 8), uVar6 != 1)) {
            pfVar10 = (float *)(local_148 + 0xc);
          }
          fVar24 = (float)local_108._0_4_;
          if ((uVar6 != 0) && (fVar24 = (float)local_f8._0_4_, uVar6 != 1)) {
            fVar24 = (float)local_98._0_4_;
          }
          auVar65 = ZEXT416((uint)((1.0 / fVar25) * (*pfVar10 - fVar24)));
          auVar26 = ZEXT416((uint)((1.0 / fVar25) *
                                  ((pBVar9->pMin).super_Tuple3<pbrt::Point3,_float>.x - fVar62)));
          auVar19 = vminss_avx(auVar65,auVar26);
          auVar45 = vmaxss_avx(auVar19,auVar45);
          auVar19 = vmaxss_avx(auVar26,auVar65);
          auVar19 = vminss_avx(ZEXT416((uint)(auVar19._0_4_ * 1.0000004)),auVar59._0_16_);
          auVar59 = ZEXT1664(auVar19);
          if (auVar19._0_4_ < auVar45._0_4_) break;
          bVar4 = 1 < uVar6;
          uVar6 = uVar6 + 1;
        } while (uVar6 != 3);
        if (bVar4) {
          if (local_d0 == '\0') {
            auVar19 = vfmadd231ss_fma(ZEXT416((uint)((float)local_c8._0_4_ * (float)local_c8._0_4_))
                                      ,ZEXT416((uint)local_118._0_4_),ZEXT416((uint)local_118._0_4_)
                                     );
            auVar19 = vfmadd231ss_fma(auVar19,local_b8,local_b8);
            if (auVar19._0_4_ < 0.0) {
              fVar25 = sqrtf(auVar19._0_4_);
            }
            else {
              auVar19 = vsqrtss_avx(auVar19,auVar19);
              fVar25 = auVar19._0_4_;
            }
            auVar57._0_4_ = (float)local_118._0_4_ / fVar25;
            auVar57._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar46._0_4_ = local_b8._0_4_ / fVar25;
            auVar46._4_12_ = local_b8._4_12_;
            auVar19 = vfmadd231ss_fma(ZEXT416((uint)(((float)local_c8._0_4_ / fVar25) *
                                                    local_e0._4_4_)),auVar57,ZEXT416((uint)local_e0)
                                     );
            auVar19 = vfmadd231ss_fma(auVar19,auVar46,ZEXT416((uint)local_d8));
            bVar5 = local_d4 <= auVar19._0_4_;
            local_168.data_._0_1_ = bVar5;
            local_160.ptr_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (!bVar5) goto LAB_00337f0d;
          }
          else {
            local_168.data_ = local_168.data_ & 0xffffffffffffff00;
LAB_00337f0d:
            local_160.ptr_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            testing::Message::Message((Message *)&local_158);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_138,(internal *)&local_168,(AssertionResult *)"Inside(c, w)",
                       "false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_a8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/vecmath_test.cpp"
                       ,0x1b3,(char *)local_138);
            testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_158);
            testing::internal::AssertHelper::~AssertHelper(&local_a8);
            if (local_138 != (undefined1  [8])&local_128) {
              operator_delete((void *)local_138,local_128._M_allocated_capacity + 1);
            }
            if (local_158.data_ != (AssertHelperData *)0x0) {
              bVar5 = testing::internal::IsTrue(true);
              if ((bVar5) && (local_158.data_ != (AssertHelperData *)0x0)) {
                (**(code **)(*(long *)local_158.data_ + 8))();
              }
              local_158.data_ = (AssertHelperData *)0x0;
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_160,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        }
        if (local_d0 == '\0') {
          auVar19 = vfmadd231ss_fma(ZEXT416((uint)((float)local_c8._0_4_ * (float)local_c8._0_4_)),
                                    ZEXT416((uint)local_118._0_4_),ZEXT416((uint)local_118._0_4_));
          auVar19 = vfmadd231ss_fma(auVar19,local_b8,local_b8);
          if (auVar19._0_4_ < 0.0) {
            fVar25 = sqrtf(auVar19._0_4_);
          }
          else {
            auVar19 = vsqrtss_avx(auVar19,auVar19);
            fVar25 = auVar19._0_4_;
          }
          auVar58._0_4_ = (float)local_118._0_4_ / fVar25;
          auVar58._4_12_ = SUB6012((undefined1  [60])0x0,0);
          auVar47._0_4_ = local_b8._0_4_ / fVar25;
          auVar47._4_12_ = local_b8._4_12_;
          auVar19 = vfmadd231ss_fma(ZEXT416((uint)(((float)local_c8._0_4_ / fVar25) * local_e0._4_4_
                                                  )),auVar58,ZEXT416((uint)local_e0));
          auVar19 = vfmadd231ss_fma(auVar19,auVar47,ZEXT416((uint)local_d8));
          if (auVar19._0_4_ < local_d4) goto LAB_00338069;
        }
        else {
LAB_00338069:
          local_168.data_ =
               (AssertHelperData *)(CONCAT71(local_168.data_._1_7_,~bVar4) & 0xffffffffffffff01);
          local_160.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if ((~bVar4 & 1U) == 0) {
            testing::Message::Message((Message *)&local_158);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_138,(internal *)&local_168,(AssertionResult *)"hit","true",
                       "false",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_a8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/vecmath_test.cpp"
                       ,0x1b5,(char *)local_138);
            testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_158);
            testing::internal::AssertHelper::~AssertHelper(&local_a8);
            if (local_138 != (undefined1  [8])&local_128) {
              operator_delete((void *)local_138,local_128._M_allocated_capacity + 1);
            }
            if (local_158.data_ != (AssertHelperData *)0x0) {
              bVar4 = testing::internal::IsTrue(true);
              if ((bVar4) && (local_158.data_ != (AssertHelperData *)0x0)) {
                (**(code **)(*(long *)local_158.data_ + 8))();
              }
              local_158.data_ = (AssertHelperData *)0x0;
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_160,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        }
        iVar16 = iVar16 + 1;
      } while (iVar16 != 1000);
    }
    else {
      auVar43._8_8_ = local_f8._0_8_;
      auVar43._0_8_ = local_f8._0_8_;
      auVar20._0_16_ = vgatherqps_avx512vl(*puVar11);
      uVar17 = vcmpps_avx512vl(auVar43,auVar20._0_16_,2);
      uVar1 = vcmpps_avx512vl(auVar20._0_16_,auVar43,2);
      auVar19 = vpmovm2d_avx512vl(uVar1);
      auVar65 = vpmovm2d_avx512vl(uVar17);
      auVar19 = vpblendd_avx2(auVar65,auVar19,0xc);
      uVar17 = vpmovd2m_avx512vl(auVar19);
      if ((~(ushort)uVar17 & 0xf) != 0) goto LAB_00337c07;
      local_168.data_._0_4_ = -1.0;
      testing::internal::CmpHelperEQ<float,float>
                ((internal *)local_138,"std::cos(Pi)","c.cosTheta",(float *)&local_168,&local_d4);
      if (local_138[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_168);
        pcVar12 = "";
        if ((undefined8 *)CONCAT44(uStack_12c,local_130) != (undefined8 *)0x0) {
          pcVar12 = *(char **)CONCAT44(uStack_12c,local_130);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_158,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/vecmath_test.cpp"
                   ,0x1a9,pcVar12);
        testing::internal::AssertHelper::operator=(&local_158,(Message *)&local_168);
        testing::internal::AssertHelper::~AssertHelper(&local_158);
        if (local_168.data_ != (AssertHelperData *)0x0) {
          bVar4 = testing::internal::IsTrue(true);
          if ((bVar4) && (local_168.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_168.data_ + 8))();
          }
          local_168.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_130,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    uVar6 = (int)local_78 + 1;
    uVar18 = (ulong)uVar6;
    if (uVar6 == 1000) {
      return;
    }
  } while( true );
}

Assistant:

TEST(DirectionCone, BoundBounds) {
    Bounds3f b(Point3f(0, 0, 0), Point3f(1, 1, 1));

    // Point inside the bbox
    DirectionCone c = BoundSubtendedDirections(b, Point3f(.1, .2, .3));
    EXPECT_EQ(std::cos(Pi), c.cosTheta);

    // Outside, .5 units away in the middle (so using the direction to the
    // center gives the best bound).
    //
    // tan theta = (sqrt(.5^2 + .5^2)) / .5
    c = BoundSubtendedDirections(b, Point3f(-.5, .5, .5));
    Float theta = std::acos(c.cosTheta);
    Float precise = std::atan(std::sqrt(.5 * .5 + .5 * .5) / .5);
    // Make sure the returned bound isn't too small.
    EXPECT_GE(theta, 1.0001 * precise);
    // It's fine for it to be a bit big (as it is in practice due to
    // approximations for performance), but it shouldn't be too big.
    EXPECT_LT(theta, 1.1 * precise);

    RNG rng(512);
    for (int i = 0; i < 1000; ++i) {
        Bounds3f b(
            Point3f(Lerp(rng.Uniform<Float>(), -1, 1), Lerp(rng.Uniform<Float>(), -1, 1),
                    Lerp(rng.Uniform<Float>(), -1, 1)),
            Point3f(Lerp(rng.Uniform<Float>(), -1, 1), Lerp(rng.Uniform<Float>(), -1, 1),
                    Lerp(rng.Uniform<Float>(), -1, 1)));

        Point3f p(Lerp(rng.Uniform<Float>(), -4, 4), Lerp(rng.Uniform<Float>(), -4, 4),
                  Lerp(rng.Uniform<Float>(), -4, 4));

        c = BoundSubtendedDirections(b, p);
        if (Inside(p, b))
            EXPECT_EQ(std::cos(Pi), c.cosTheta);
        else {
            Vector3f wx, wy;
            CoordinateSystem(c.w, &wx, &wy);
            for (int j = 0; j < 1000; ++j) {
                Point2f u(rng.Uniform<Float>(), rng.Uniform<Float>());
                Vector3f w = SampleUniformSphere(u);
                Ray r(p, w);
                bool hit = b.IntersectP(r.o, r.d);
                if (hit)
                    EXPECT_TRUE(Inside(c, w));
                if (!Inside(c, w))
                    EXPECT_FALSE(hit);
            }
        }
    }
}